

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

qint64 __thiscall
QSocks5SocketEngine::readDatagram
          (QSocks5SocketEngine *this,char *data,qint64 maxlen,QIpPacketHeader *header,
          PacketHeaderOptions param_4)

{
  undefined1 *puVar1;
  char *__src;
  size_t __n;
  long in_FS_OFFSET;
  QSocks5RevivedDatagram datagram;
  undefined1 local_58 [48];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(*(long *)(this + 8) + 0x108) + 0x38) == 0) {
    __n = 0;
  }
  else {
    local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QList<QSocks5RevivedDatagram>::takeFirst
              ((value_type *)local_58,
               (QList<QSocks5RevivedDatagram> *)(*(long *)(*(long *)(this + 8) + 0x108) + 0x28));
    puVar1 = (undefined1 *)(long)(int)maxlen;
    if ((long)local_58._16_8_ < (long)(int)maxlen) {
      puVar1 = (undefined1 *)local_58._16_8_;
    }
    __src = (char *)local_58._8_8_;
    if ((char *)local_58._8_8_ == (char *)0x0) {
      __src = (char *)&QByteArray::_empty;
    }
    __n = (size_t)(int)puVar1;
    memcpy(data,__src,__n);
    if (header != (QIpPacketHeader *)0x0) {
      QHostAddress::operator=(&header->senderAddress,(QHostAddress *)(local_58 + 0x18));
      header->senderPort = local_58._32_2_;
    }
    QHostAddress::~QHostAddress((QHostAddress *)(local_58 + 0x18));
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __n;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::readDatagram(char *data, qint64 maxlen, QIpPacketHeader *header, PacketHeaderOptions)
{
#ifndef QT_NO_UDPSOCKET
    Q_D(QSocks5SocketEngine);

    if (d->udpData->pendingDatagrams.isEmpty())
        return 0;

    QSocks5RevivedDatagram datagram = d->udpData->pendingDatagrams.dequeue();
    int copyLen = qMin<int>(maxlen, datagram.data.size());
    memcpy(data, datagram.data.constData(), copyLen);
    if (header) {
        header->senderAddress = datagram.address;
        header->senderPort = datagram.port;
    }
    return copyLen;
#else
    Q_UNUSED(data);
    Q_UNUSED(maxlen);
    Q_UNUSED(header);
    return -1;
#endif // QT_NO_UDPSOCKET
}